

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryReader::readGlobals(WasmBinaryReader *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  ostream *poVar4;
  type *ptVar5;
  pointer pGVar6;
  char *pcVar7;
  pair<std::__detail::_Node_iterator<wasm::Name,_true,_true>,_bool> pVar8;
  string_view sVar9;
  Name name_00;
  Name name_01;
  Name name_02;
  undefined7 in_stack_fffffffffffffde8;
  byte in_stack_fffffffffffffdef;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> local_168;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> global;
  Expression *init;
  string local_150;
  uint32_t local_12c;
  Type TStack_128;
  uint32_t mutable_;
  Type type;
  type_conflict1 *isExplicit;
  type *name_1;
  string local_108;
  string_view local_e8;
  pair<wasm::Name,_bool> local_d8;
  ulong local_c0;
  size_t i;
  undefined1 local_b0;
  ostream *local_a8;
  char *pcStack_a0;
  type *local_88;
  type *name;
  type *index;
  _Node_iterator_base<std::pair<const_unsigned_int,_wasm::Name>,_false> local_70;
  iterator __end1;
  iterator __begin1;
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  *__range1;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  usedNames;
  size_type numImports;
  size_t num;
  WasmBinaryReader *this_local;
  
  uVar2 = getU32LEB(this);
  usedNames._M_h._M_single_bucket =
       (__node_base_ptr)
       std::
       vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
       ::size(&this->wasm->globals);
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&__range1);
  __end1 = std::
           unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
           ::begin(&this->globalNames);
  local_70._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
       ::end(&this->globalNames);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Name>,_false>,
                       &local_70);
    if (!bVar1) break;
    index = &std::__detail::_Node_iterator<std::pair<const_unsigned_int,_wasm::Name>,_false,_false>
             ::operator*(&__end1)->first;
    name = (type *)std::get<0ul,unsigned_int_const,wasm::Name>
                             ((pair<const_unsigned_int,_wasm::Name> *)index);
    local_88 = std::get<1ul,unsigned_int_const,wasm::Name>
                         ((pair<const_unsigned_int,_wasm::Name> *)index);
    pcVar7 = (char *)((long)&(usedNames._M_h._M_single_bucket)->_M_nxt + (ulong)uVar2);
    if (pcVar7 <= (char *)(ulong)(uint)(name->super_IString).str._M_len) {
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "warning: global index out of bounds in name section: ");
      local_a8 = (ostream *)(local_88->super_IString).str._M_len;
      pcStack_a0 = (local_88->super_IString).str._M_str;
      name_00.super_IString.str._M_str = pcVar7;
      name_00.super_IString.str._M_len = (size_t)pcStack_a0;
      poVar4 = wasm::operator<<((wasm *)poVar4,local_a8,name_00);
      poVar4 = std::operator<<(poVar4," at index ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(uint)(name->super_IString).str._M_len);
      std::operator<<(poVar4,'\n');
    }
    pVar8 = std::
            unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
            ::insert((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                      *)&__range1,local_88);
    i = (size_t)pVar8.first.super__Node_iterator_base<wasm::Name,_true>._M_cur;
    local_b0 = pVar8.second;
    std::__detail::_Node_iterator<std::pair<const_unsigned_int,_wasm::Name>,_false,_false>::
    operator++(&__end1);
  }
  local_c0 = 0;
  while( true ) {
    if (uVar2 <= local_c0) {
      std::
      unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                        *)&__range1);
      return;
    }
    uVar3 = (int)usedNames._M_h._M_single_bucket + (int)local_c0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"global$",(allocator<char> *)((long)&name_1 + 7));
    sVar9 = (string_view)makeName(&local_108,local_c0);
    name_01.super_IString.str._M_str = (char *)&__range1;
    name_01.super_IString.str._M_len = (size_t)sVar9._M_str;
    local_e8 = sVar9;
    getOrMakeName(&local_d8,(wasm *)&this->globalNames,
                  (unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                   *)(ulong)uVar3,(Index)sVar9._M_len,name_01,
                  (unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator((allocator<char> *)((long)&name_1 + 7));
    ptVar5 = std::get<0ul,wasm::Name,bool>(&local_d8);
    type.id = (uintptr_t)std::get<1ul,wasm::Name,bool>(&local_d8);
    TStack_128 = getConcreteType(this);
    local_12c = getU32LEB(this);
    if ((local_12c & 0xfffffffe) != 0) break;
    global._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
    super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true>)
         readExpression(this);
    name_02.super_IString.str._M_str = (char *)(ptVar5->super_IString).str._M_len;
    name_02.super_IString.str._M_len = (size_t)&local_168;
    Builder::makeGlobal(name_02,(Type)(ptVar5->super_IString).str._M_str,(Expression *)TStack_128.id
                        ,(Mutability)
                         global._M_t.
                         super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                         super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl);
    in_stack_fffffffffffffdef = *(byte *)type.id;
    pGVar6 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                       (&local_168);
    (pGVar6->super_Importable).super_Named.hasExplicitName = (bool)(in_stack_fffffffffffffdef & 1);
    Module::addGlobal(this->wasm,&local_168);
    std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr(&local_168);
    local_c0 = local_c0 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"Global mutability must be 0 or 1",
             (allocator<char> *)((long)&init + 7));
  throwError(this,&local_150);
}

Assistant:

void WasmBinaryReader::readGlobals() {
  size_t num = getU32LEB();
  auto numImports = wasm.globals.size();
  std::unordered_set<Name> usedNames;
  for (auto& [index, name] : globalNames) {
    if (index >= num + numImports) {
      std::cerr << "warning: global index out of bounds in name section: "
                << name << " at index " << index << '\n';
    }
    usedNames.insert(name);
  }
  for (size_t i = 0; i < num; i++) {
    auto [name, isExplicit] = getOrMakeName(
      globalNames, numImports + i, makeName("global$", i), usedNames);
    auto type = getConcreteType();
    auto mutable_ = getU32LEB();
    if (mutable_ & ~1) {
      throwError("Global mutability must be 0 or 1");
    }
    auto* init = readExpression();
    auto global = Builder::makeGlobal(
      name, type, init, mutable_ ? Builder::Mutable : Builder::Immutable);
    global->hasExplicitName = isExplicit;
    wasm.addGlobal(std::move(global));
  }
}